

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

uint32_t nh_string_to_uint(http_string_t string)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  if (string.len != 0 && string.value != (char *)0x0) {
    uVar4 = 0;
    uVar3 = 1;
    uVar2 = 0;
    do {
      bVar1 = string.value[uVar4];
      if (9 < (byte)(bVar1 - 0x30)) {
        return uVar2;
      }
      uVar2 = ((uint)bVar1 + uVar2 * 10) - 0x30;
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < string.len);
  }
  return uVar2;
}

Assistant:

uint32_t nh_string_to_uint(http_string_t string) {
    if (string.value == NULL) {
        return 0;
    }
    uint32_t result = 0;
    uint32_t index = 0;
    while (index < string.len && string.value[index] >= '0' && string.value[index] <= '9') {
        result = result * 10 + string.value[index] - 48;
        ++index;
    }
    return result;
}